

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void selection_changed(Fl_Type *p)

{
  uint uVar1;
  Fl_Type *local_30;
  Fl_Type *o_1;
  Fl_Type *q;
  Fl_Type *o;
  Fl_Type *q_1;
  Fl_Type *p_local;
  
  q_1 = p;
  if ((((p == (Fl_Type *)0x0) || (the_panel == (Fl_Window *)0x0)) ||
      (uVar1 = Fl_Widget::visible((Fl_Widget *)the_panel), uVar1 == 0)) ||
     (set_cb((Fl_Button *)0x0,(void *)0x0), haderror == 0)) {
    o_1 = (Fl_Type *)0x0;
    for (local_30 = Fl_Type::first; local_30 != (Fl_Type *)0x0; local_30 = local_30->next) {
      local_30->selected = local_30->new_selected;
      if ((o_1 == (Fl_Type *)0x0) && (local_30->selected != '\0')) {
        o_1 = local_30;
      }
    }
    if ((p == (Fl_Type *)0x0) || (p->selected == '\0')) {
      q_1 = o_1;
    }
    Fl_Type::current = q_1;
    check_redraw_corresponding_parent(q_1);
    redraw_overlays();
    load_panel();
    update_sourceview_position();
  }
  else {
    o = (Fl_Type *)0x0;
    for (q = Fl_Type::first; q != (Fl_Type *)0x0; q = q->next) {
      q->new_selected = q->selected;
      if ((o == (Fl_Type *)0x0) && (q->selected != '\0')) {
        o = q;
      }
    }
    if ((p == (Fl_Type *)0x0) || (p->selected == '\0')) {
      q_1 = o;
    }
    Fl_Type::current = q_1;
    redraw_browser();
  }
  return;
}

Assistant:

void selection_changed(Fl_Type *p) {
  // store all changes to the current selected objects:
  if (p && the_panel && the_panel->visible()) {
    set_cb(0,0);
    // if there was an error, we try to leave the selected set unchanged:
    if (haderror) {
      Fl_Type *q = 0;
      for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
	o->new_selected = o->selected;
	if (!q && o->selected) q = o;
      }
      if (!p || !p->selected) p = q;
      Fl_Type::current = p;
      redraw_browser();
      return;
    }
  }
  // update the selected flags to new set:
  Fl_Type *q = 0;
  for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
    o->selected = o->new_selected;
    if (!q && o->selected) q = o;
  }
  if (!p || !p->selected) p = q;
  Fl_Type::current = p;
  check_redraw_corresponding_parent(p);
  redraw_overlays();
  // load the panel with the new settings:
  load_panel();
  // update the source viewer to show the code for the selected object
  update_sourceview_position();
}